

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_98;
  StringTree *local_80;
  StringTree *local_78;
  ArrayPtr<const_char> *local_70;
  ArrayPtr<const_char> *local_68;
  size_t local_60;
  char *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_60 = this->size_;
  local_58 = (params->text).content.ptr;
  sStack_50 = params_1->size_;
  local_48 = params_2->size_;
  sStack_40 = params_3->size_;
  local_38 = params_4->size_;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x6;
  local_80 = this;
  sVar1 = _::sum((_ *)&local_60,nums);
  local_60 = 0;
  __return_storage_ptr__->size_ = sVar1;
  local_58 = (params->text).content.ptr;
  sStack_50 = params_1->size_;
  local_48 = params_2->size_;
  sStack_40 = params_3->size_;
  local_38 = params_4->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x6;
  local_78 = params;
  local_70 = params_1;
  local_68 = params_2;
  sVar1 = _::sum((_ *)&local_60,nums_00);
  heapString((String *)&local_98,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_98);
  Array<char>::~Array((Array<char> *)&local_98);
  local_60 = 1;
  local_58 = (char *)0x0;
  sStack_50 = 0;
  local_48 = 0;
  sStack_40 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x6;
  sVar1 = _::sum((_ *)&local_60,nums_01);
  local_98.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_98.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_98.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_98);
  Array<kj::StringTree::Branch>::~Array(&local_98);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_80,(ArrayPtr<const_char> *)local_78,local_70,
             local_68,params_3,params_4);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}